

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O0

void __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0,void,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&>
          (functional_internal *this,VoidPtr ptr,type args,type args_1)

{
  anon_class_16_2_39a01b4a *o;
  type args_local_1;
  type args_local;
  VoidPtr ptr_local;
  
  args_local._M_len = args._M_len;
  args_local_1 = (type)ptr;
  args_local._M_str = (char *)this;
  std::
  invoke<absl::lts_20250127::status_internal::StatusRep::ToString[abi:cxx11](absl::lts_20250127::StatusToStringMode)const::__0_const&,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Cord_const&>
            ((anon_class_16_2_39a01b4a *)this,
             (basic_string_view<char,_std::char_traits<char>_> *)&args_local_1,(Cord *)args._M_str);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}